

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O1

AST * jsonnet::internal::jsonnet_parse(Allocator *alloc,Tokens *tokens)

{
  _List_node_base *p_Var1;
  AST *pAVar2;
  StaticError *this;
  Parser parser;
  stringstream ss;
  string local_1d0;
  Parser local_1b0;
  stringstream local_1a0 [16];
  ostream local_190 [376];
  
  local_1b0.tokens = tokens;
  local_1b0.alloc = alloc;
  pAVar2 = anon_unknown_0::Parser::parse(&local_1b0,0xf);
  if (*(int *)&(tokens->
               super__List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>
               )._M_impl._M_node.super__List_node_base._M_next[1]._M_next == 0x24) {
    return pAVar2;
  }
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>(local_190,"did not expect: ",0x10);
  operator<<(local_190,
             (Token *)((tokens->
                       super__List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>
                       )._M_impl._M_node.super__List_node_base._M_next + 1));
  this = (StaticError *)__cxa_allocate_exception(0x60);
  p_Var1 = (tokens->
           super__List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>).
           _M_impl._M_node.super__List_node_base._M_next;
  std::__cxx11::stringbuf::str();
  StaticError::StaticError(this,(LocationRange *)(p_Var1 + 9),&local_1d0);
  __cxa_throw(this,&StaticError::typeinfo,StaticError::~StaticError);
}

Assistant:

AST *jsonnet_parse(Allocator *alloc, Tokens &tokens)
{
    Parser parser(tokens, alloc);
    AST *expr = parser.parse(MAX_PRECEDENCE);
    if (tokens.front().kind != Token::END_OF_FILE) {
        std::stringstream ss;
        ss << "did not expect: " << tokens.front();
        throw StaticError(tokens.front().location, ss.str());
    }

    return expr;
}